

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LayoutBindingRenderCase::~LayoutBindingRenderCase
          (LayoutBindingRenderCase *this)

{
  code *pcVar1;
  LayoutBindingRenderCase *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

LayoutBindingRenderCase::~LayoutBindingRenderCase (void)
{
	deinit();
}